

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_compute_ttf_font_glyph_metrics
               (rf_ttf_font_info *font_info,int *codepoints,rf_int codepoints_count,
               rf_glyph_info *dst,rf_int dst_count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 *puVar4;
  ushort uVar5;
  int *piVar6;
  stbtt_fontinfo *info;
  undefined1 *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int end_y;
  int end_x;
  int begin_y;
  int begin_x;
  float local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  rf_int local_50;
  float local_48;
  float local_44;
  stbtt_fontinfo *local_40;
  int *local_38;
  
  if ((((font_info != (rf_ttf_font_info *)0x0) && (codepoints_count <= dst_count)) &&
      (dst != (rf_glyph_info *)0x0)) && (font_info->valid != false)) {
    *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
    font_info->largest_glyph_size = 0;
    if (0 < codepoints_count) {
      local_40 = (stbtt_fontinfo *)&font_info->internal_stb_font_info;
      local_64 = font_info->scale_factor;
      info = (stbtt_fontinfo *)(font_info->internal_stb_font_info).data;
      iVar2 = (font_info->internal_stb_font_info).index_map;
      piVar6 = &dst->advance_x;
      lVar8 = 0;
      local_50 = codepoints_count;
      local_38 = codepoints;
      do {
        piVar6[-3] = local_38[lVar8];
        local_54 = 0;
        local_58 = 0;
        local_5c = 0;
        local_60 = 0;
        iVar2 = stbtt_FindGlyphIndex(info,iVar2);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (local_40,iVar2,local_64,local_64,in_XMM2_Da,in_XMM3_Da,&local_54,&local_58,
                   &local_5c,&local_60);
        local_44 = (float)(local_5c - local_54);
        piVar6[-5] = (int)local_44;
        local_48 = (float)(local_60 - local_58);
        piVar6[-4] = (int)local_48;
        piVar6[-2] = local_54;
        local_64 = font_info->scale_factor;
        piVar6[-1] = (int)((float)font_info->ascent * local_64) + local_58;
        info = (stbtt_fontinfo *)(font_info->internal_stb_font_info).data;
        iVar2 = (font_info->internal_stb_font_info).index_map;
        iVar3 = stbtt_FindGlyphIndex(info,iVar2);
        uVar5 = *(ushort *)((long)&info->glyf + (long)(font_info->internal_stb_font_info).hhea + 2);
        uVar5 = uVar5 << 8 | uVar5 >> 8;
        iVar1 = (font_info->internal_stb_font_info).hmtx;
        puVar7 = (undefined1 *)((long)&info->userdata + (long)(iVar3 * 4) + 1 + (long)iVar1);
        if ((int)(uint)uVar5 <= iVar3) {
          puVar7 = (undefined1 *)((long)info + (ulong)uVar5 * 4 + (long)iVar1 + -3);
        }
        puVar4 = (undefined1 *)((long)info + (ulong)uVar5 * 4 + (long)iVar1 + -4);
        if (iVar3 < (int)(uint)uVar5) {
          puVar4 = (undefined1 *)((long)&info->userdata + (long)(iVar3 * 4) + (long)iVar1);
        }
        *piVar6 = (int)((float)(int)CONCAT11(*puVar4,*puVar7) * local_64);
        if (font_info->largest_glyph_size < (int)(local_44 * local_48)) {
          font_info->largest_glyph_size = (int)(local_44 * local_48);
        }
        lVar8 = lVar8 + 1;
        piVar6 = piVar6 + 8;
      } while (local_50 != lVar8);
    }
  }
  return;
}

Assistant:

RF_API void rf_compute_ttf_font_glyph_metrics(rf_ttf_font_info* font_info, const int* codepoints, rf_int codepoints_count, rf_glyph_info* dst, rf_int dst_count)
{
    if (font_info && font_info->valid)
    {
        if (dst && dst_count >= codepoints_count)
        {
            // The stbtt functions called here should not require any allocations
            RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

            font_info->largest_glyph_size = 0;

            float required_area = 0;

            // NOTE: Using simple packaging, one char after another
            for (rf_int i = 0; i < codepoints_count; i++)
            {
                stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                dst[i].codepoint = codepoints[i];

                int begin_x = 0;
                int begin_y = 0;
                int end_x   = 0;
                int end_y   = 0;
                stbtt_GetCodepointBitmapBox(stbtt_ctx, dst[i].codepoint, font_info->scale_factor, font_info->scale_factor, &begin_x, &begin_y, &end_x, &end_y);

                dst[i].width  = end_x - begin_x;
                dst[i].height = end_y - begin_y;
                dst[i].offset_x = begin_x;
                dst[i].offset_y = begin_y;
                dst[i].offset_y += (int) ((float)font_info->ascent * font_info->scale_factor);

                stbtt_GetCodepointHMetrics(stbtt_ctx, dst[i].codepoint, &dst[i].advance_x, NULL);
                dst[i].advance_x *= font_info->scale_factor;

                const int char_size = dst[i].width * dst[i].height;
                if (char_size > font_info->largest_glyph_size) font_info->largest_glyph_size = char_size;
            }
        }
    }
}